

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxmlparser.cpp
# Opt level: O1

bool __thiscall QDBusXmlParser::parseSignal(QDBusXmlParser *this,Signal *signalData)

{
  int iVar1;
  DiagnosticsReporter *pDVar2;
  QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>
  *pQVar3;
  qint64 qVar4;
  qint64 qVar5;
  int *piVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  undefined8 *puVar10;
  storage_type_conflict *extraout_RDX;
  long extraout_RDX_00;
  QArrayData *pQVar11;
  Argument *pAVar12;
  long in_FS_OFFSET;
  QAnyStringView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView memberName;
  undefined1 auVar25 [16];
  Argument argument;
  QString local_118;
  Annotations local_100;
  QArrayData *local_f8;
  undefined8 *puStack_f0;
  undefined1 *local_e8;
  QArrayDataPointer<QDBusIntrospection::Argument> local_d8;
  QString local_b8;
  QArrayDataPointer<QXmlStreamAttribute> local_98;
  Argument local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QXmlStreamAttribute *)&DAT_aaaaaaaaaaaaaaaa;
  QXmlStreamReader::attributes();
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QVar13.m_size = (size_t)"name";
  QVar13.field_0.m_data = &local_98;
  auVar25 = QXmlStreamAttributes::value(QVar13);
  QString::QString(&local_b8,auVar25._8_8_,auVar25._0_8_);
  memberName.m_data = extraout_RDX;
  memberName.m_size = (qsizetype)local_b8.d.ptr;
  bVar7 = QDBusUtil::isValidMemberName((QDBusUtil *)local_b8.d.size,memberName);
  if (bVar7) {
    QString::operator=(&signalData->name,&local_b8);
    local_78.location.lineNumber._0_4_ = 0x12;
    local_78.location.lineNumber._4_4_ = 0;
    local_78.location.columnNumber._0_4_ = 0x19ed0d;
    local_78.location.columnNumber._4_4_ = 0;
    local_78.type.d.ptr = (char16_t *)CONCAT62(local_78.type.d.ptr._2_6_,0x22);
    local_78.type.d.d = (Data *)&local_b8;
    operator+=(&((this->m_currentInterface)._M_t.
                 super___uniq_ptr_impl<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QDBusIntrospection::Interface_*,_std::default_delete<QDBusIntrospection::Interface>_>
                 .super__Head_base<0UL,_QDBusIntrospection::Interface_*,_false>._M_head_impl)->
                introspection,
               (QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_char16_t> *)&local_78
              );
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (Argument *)0x0;
    local_d8.size = 0;
    local_100.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_*>
            )0x0;
    bVar8 = readNextStartElement(this);
    QVar14.m_size =
         &((this->m_currentInterface)._M_t.
           super___uniq_ptr_impl<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_QDBusIntrospection::Interface_*,_std::default_delete<QDBusIntrospection::Interface>_>
           .super__Head_base<0UL,_QDBusIntrospection::Interface_*,_false>._M_head_impl)->
          introspection;
    if (bVar8) {
      QVar14.m_data = (char *)0x2;
      QString::append(QVar14);
      do {
        auVar25 = QXmlStreamReader::name();
        if (auVar25._0_8_ == 10) {
          QVar15.m_data = "annotation";
          QVar15.m_size = 10;
          QVar22.m_data = auVar25._8_8_;
          QVar22.m_size = 10;
          cVar9 = QtPrivate::equalStrings(QVar15,QVar22);
          if (cVar9 == '\0') goto LAB_00192291;
          parseAnnotation(this,&local_100,false);
        }
        else {
LAB_00192291:
          auVar25 = QXmlStreamReader::name();
          if (auVar25._0_8_ == 3) {
            QVar16.m_data = "arg";
            QVar16.m_size = 3;
            QVar23.m_data = auVar25._8_8_;
            QVar23.m_size = 3;
            cVar9 = QtPrivate::equalStrings(QVar16,QVar23);
            if (cVar9 != '\0') {
              local_e8 = &DAT_aaaaaaaaaaaaaaaa;
              local_f8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
              puStack_f0 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
              QXmlStreamReader::attributes();
              local_78.name.d.d = (Data *)0x0;
              local_78.name.d.ptr = (char16_t *)0x0;
              local_78.type.d.ptr = (char16_t *)0x0;
              local_78.type.d.size = 0;
              local_78.type.d.d._0_4_ = 0;
              local_78.type.d.d._4_4_ = 0;
              local_78.name.d.size = 0;
              qVar4 = (this->m_currentLocation).lineNumber;
              qVar5 = (this->m_currentLocation).columnNumber;
              local_78.location.lineNumber._0_4_ = (undefined4)qVar4;
              local_78.location.lineNumber._4_4_ = (undefined4)((ulong)qVar4 >> 0x20);
              local_78.location.columnNumber._0_4_ = (undefined4)qVar5;
              local_78.location.columnNumber._4_4_ = (undefined4)((ulong)qVar5 >> 0x20);
              QVar17.m_size = (size_t)"direction";
              QVar17.field_0.m_data_utf8 = (char *)&local_f8;
              QXmlStreamAttributes::value(QVar17);
              if (extraout_RDX_00 == 0) {
LAB_00192390:
                parseArg(this,(QXmlStreamAttributes *)&local_f8,&local_78);
                QtPrivate::QGenericArrayOps<QDBusIntrospection::Argument>::
                emplace<QDBusIntrospection::Argument_const&>
                          ((QGenericArrayOps<QDBusIntrospection::Argument> *)&local_d8,local_d8.size
                           ,&local_78);
                QList<QDBusIntrospection::Argument>::end
                          ((QList<QDBusIntrospection::Argument> *)&local_d8);
              }
              else {
                QVar18.m_size = (size_t)"direction";
                QVar18.field_0.m_data_utf8 = (char *)&local_f8;
                auVar25 = QXmlStreamAttributes::value(QVar18);
                if ((auVar25._0_8_ == 3) &&
                   (QVar19.m_data = "out", QVar19.m_size = 3, QVar24.m_data = auVar25._8_8_,
                   QVar24.m_size = 3, cVar9 = QtPrivate::equalStrings(QVar19,QVar24), cVar9 != '\0')
                   ) goto LAB_00192390;
              }
              if (&(local_78.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_78.name.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_78.name.d.d)->super_QArrayData,2,0x10);
                }
              }
              piVar6 = (int *)CONCAT44(local_78.type.d.d._4_4_,local_78.type.d.d._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_78.type.d.d._4_4_,local_78.type.d.d._0_4_)
                             ,2,0x10);
                }
              }
              QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                        ((QArrayDataPointer<QXmlStreamAttribute> *)&local_f8);
              goto LAB_001925bd;
            }
          }
          pDVar2 = this->m_reporter;
          if (pDVar2 == (DiagnosticsReporter *)0x0) {
            QtPrivateLogging::dbusParser();
            if (((byte)QtPrivateLogging::dbusParser::category.field_2.bools.enabledDebug._q_value.
                       _M_base._M_i & 1) != 0) {
              local_78.location.lineNumber._0_4_ = 2;
              local_78.location.lineNumber._4_4_ = 0;
              local_78.location.columnNumber._0_4_ = 0;
              local_78.location.columnNumber._4_4_ = 0;
              local_78.type.d.d._0_4_ = 0;
              local_78.type.d.d._4_4_ = 0;
              local_78.type.d.ptr = (char16_t *)QtPrivateLogging::dbusParser::category.name;
              auVar25 = QXmlStreamReader::name();
              QString::QString(&local_118,auVar25._8_8_,auVar25._0_8_);
              QString::toLocal8Bit_helper((QChar *)&local_f8,(longlong)local_118.d.ptr);
              puVar10 = puStack_f0;
              if (puStack_f0 == (undefined8 *)0x0) {
                puVar10 = &QByteArray::_empty;
              }
              QMessageLogger::debug
                        ((char *)&local_78,
                         "Warning: Unknown element \'%s\' while checking for signal arguments",
                         puVar10);
              if (local_f8 != (QArrayData *)0x0) {
                LOCK();
                (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_f8,1,0x10);
                }
              }
              if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                iVar1 = ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i;
                UNLOCK();
                pQVar11 = &(local_118.d.d)->super_QArrayData;
                local_78.type.d.d =
                     (Data *)CONCAT44(local_78.type.d.d._4_4_,local_78.type.d.d._0_4_);
                goto joined_r0x001925a7;
              }
            }
          }
          else {
            auVar25 = QXmlStreamReader::name();
            QString::QString((QString *)&local_f8,auVar25._8_8_,auVar25._0_8_);
            QString::toLocal8Bit_helper((QChar *)&local_78,(longlong)puStack_f0);
            puVar10 = (undefined8 *)
                      CONCAT44(local_78.location.columnNumber._4_4_,
                               (undefined4)local_78.location.columnNumber);
            if (puVar10 == (undefined8 *)0x0) {
              puVar10 = &QByteArray::_empty;
            }
            (*pDVar2->_vptr_DiagnosticsReporter[2])
                      (pDVar2,&this->m_currentLocation,
                       "Unknown element \'%s\' while checking for signal arguments\n",puVar10);
            piVar6 = (int *)CONCAT44(local_78.location.lineNumber._4_4_,
                                     (undefined4)local_78.location.lineNumber);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)
                           CONCAT44(local_78.location.lineNumber._4_4_,
                                    (undefined4)local_78.location.lineNumber),1,0x10);
              }
            }
            if (local_f8 != (QArrayData *)0x0) {
              LOCK();
              (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              iVar1 = (local_f8->ref_)._q_value.super___atomic_base<int>._M_i;
              UNLOCK();
              pQVar11 = local_f8;
joined_r0x001925a7:
              if (iVar1 == 0) {
                QArrayData::deallocate(pQVar11,2,0x10);
              }
            }
          }
        }
LAB_001925bd:
        QXmlStreamReader::skipCurrentElement();
        bVar8 = readNextStartElement(this);
      } while (bVar8);
      QVar20.m_size =
           &((this->m_currentInterface)._M_t.
             super___uniq_ptr_impl<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
             ._M_t.
             super__Tuple_impl<0UL,_QDBusIntrospection::Interface_*,_std::default_delete<QDBusIntrospection::Interface>_>
             .super__Head_base<0UL,_QDBusIntrospection::Interface_*,_false>._M_head_impl)->
            introspection;
      QVar20.m_data = (char *)0xe;
      QString::append(QVar20);
    }
    else {
      QVar21.m_data = (char *)0x3;
      QVar21.m_size = (qsizetype)QVar14.m_size;
      QString::append(QVar21);
    }
    QArrayDataPointer<QDBusIntrospection::Argument>::operator=
              (&(signalData->outputArgs).d,&local_d8);
    if (local_100.d.d.ptr !=
        (totally_ordered_wrapper<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_*>
         )0x0) {
      LOCK();
      *(int *)local_100.d.d.ptr = *(int *)local_100.d.d.ptr + 1;
      UNLOCK();
    }
    pQVar3 = (signalData->annotations).d.d.ptr;
    (signalData->annotations).d.d.ptr =
         (QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>
          *)local_100.d.d.ptr;
    local_78.location.lineNumber._0_4_ = SUB84(pQVar3,0);
    local_78.location.lineNumber._4_4_ = (undefined4)((ulong)pQVar3 >> 0x20);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_>
                *)&local_78);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_100.d);
    QArrayDataPointer<QDBusIntrospection::Argument>::~QArrayDataPointer(&local_d8);
    goto LAB_0019280d;
  }
  pDVar2 = this->m_reporter;
  if (pDVar2 == (DiagnosticsReporter *)0x0) {
    QtPrivateLogging::dbusParser();
    local_78.type.d.d = (Data *)CONCAT44(local_78.type.d.d._4_4_,local_78.type.d.d._0_4_);
    if (((byte)QtPrivateLogging::dbusParser::category.field_2.bools.enabledDebug._q_value._M_base.
               _M_i & 1) == 0) goto LAB_0019280d;
    local_78.location.lineNumber._0_4_ = 2;
    local_78.location.lineNumber._4_4_ = 0;
    local_78.location.columnNumber._0_4_ = 0;
    local_78.location.columnNumber._4_4_ = 0;
    local_78.type.d.d._0_4_ = 0;
    local_78.type.d.d._4_4_ = 0;
    local_78.type.d.ptr = (char16_t *)QtPrivateLogging::dbusParser::category.name;
    QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.d.ptr);
    pAVar12 = local_d8.ptr;
    if (local_d8.ptr == (Argument *)0x0) {
      pAVar12 = (Argument *)&QByteArray::_empty;
    }
    QString::toLocal8Bit_helper
              ((QChar *)&local_f8,
               (longlong)
               (((this->m_currentInterface)._M_t.
                 super___uniq_ptr_impl<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QDBusIntrospection::Interface_*,_std::default_delete<QDBusIntrospection::Interface>_>
                 .super__Head_base<0UL,_QDBusIntrospection::Interface_*,_false>._M_head_impl)->name)
               .d.ptr);
    puVar10 = puStack_f0;
    if (puStack_f0 == (undefined8 *)0x0) {
      puVar10 = &QByteArray::_empty;
    }
    QMessageLogger::debug
              ((char *)&local_78,
               "Error: Invalid D-Bus member name \'%s\' found in interface \'%s\' while parsing introspection"
               ,pAVar12,puVar10);
    if (local_f8 != (QArrayData *)0x0) {
      LOCK();
      (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_f8,1,0x10);
      }
    }
    local_78.type.d.d = (Data *)CONCAT44(local_78.type.d.d._4_4_,local_78.type.d.d._0_4_);
    if (&(local_d8.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0019280d;
    LOCK();
    ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pQVar11 = &(local_d8.d)->super_QArrayData;
    local_78.type.d.d = (Data *)CONCAT44(local_78.type.d.d._4_4_,local_78.type.d.d._0_4_);
    if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_0019280d;
  }
  else {
    QString::toLocal8Bit_helper((QChar *)&local_78,(longlong)local_b8.d.ptr);
    puVar10 = (undefined8 *)
              CONCAT44(local_78.location.columnNumber._4_4_,
                       (undefined4)local_78.location.columnNumber);
    if (puVar10 == (undefined8 *)0x0) {
      puVar10 = &QByteArray::_empty;
    }
    QString::toLocal8Bit_helper
              ((QChar *)&local_d8,
               (longlong)
               (((this->m_currentInterface)._M_t.
                 super___uniq_ptr_impl<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QDBusIntrospection::Interface_*,_std::default_delete<QDBusIntrospection::Interface>_>
                 .super__Head_base<0UL,_QDBusIntrospection::Interface_*,_false>._M_head_impl)->name)
               .d.ptr);
    pAVar12 = local_d8.ptr;
    if (local_d8.ptr == (Argument *)0x0) {
      pAVar12 = (Argument *)&QByteArray::_empty;
    }
    (*pDVar2->_vptr_DiagnosticsReporter[3])
              (pDVar2,&this->m_currentLocation,
               "Invalid D-Bus member name \'%s\' found in interface \'%s\' while parsing introspection\n"
               ,puVar10,pAVar12);
    if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d)->super_QArrayData,1,0x10);
      }
    }
    piVar6 = (int *)CONCAT44(local_78.location.lineNumber._4_4_,
                             (undefined4)local_78.location.lineNumber);
    local_78.type.d.d = (Data *)CONCAT44(local_78.type.d.d._4_4_,local_78.type.d.d._0_4_);
    if (piVar6 == (int *)0x0) goto LAB_0019280d;
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    local_78.type.d.d = (Data *)CONCAT44(local_78.type.d.d._4_4_,local_78.type.d.d._0_4_);
    if (*piVar6 != 0) goto LAB_0019280d;
    pQVar11 = (QArrayData *)
              CONCAT44(local_78.location.lineNumber._4_4_,(undefined4)local_78.location.lineNumber);
  }
  QArrayData::deallocate(pQVar11,1,0x10);
  local_78.type.d.d = (Data *)CONCAT44(local_78.type.d.d._4_4_,local_78.type.d.d._0_4_);
LAB_0019280d:
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QDBusXmlParser::parseSignal(QDBusIntrospection::Signal &signalData)
{
    Q_ASSERT(m_currentInterface);
    Q_ASSERT(m_xml.isStartElement() && m_xml.name() == "signal"_L1);

    const QXmlStreamAttributes attributes = m_xml.attributes();
    const QString signalName = attributes.value("name"_L1).toString();

    if (!QDBusUtil::isValidMemberName(signalName)) {
        qDBusParserError("Invalid D-Bus member name '%s' found in interface '%s' while parsing "
                         "introspection",
                         qPrintable(signalName), qPrintable(m_currentInterface->name));
        return false;
    }

    signalData.name = signalName;
    m_currentInterface->introspection += "    <signal name=\""_L1 + signalName + u'"';

    QDBusIntrospection::Arguments arguments;
    QDBusIntrospection::Annotations annotations;

    if (!readNextStartElement()) {
        m_currentInterface->introspection += "/>\n"_L1;
    } else {
        m_currentInterface->introspection += ">\n"_L1;

        do {
            if (m_xml.name() == "annotation"_L1) {
                parseAnnotation(annotations);
            } else if (m_xml.name() == "arg"_L1) {
                const QXmlStreamAttributes attributes = m_xml.attributes();
                QDBusIntrospection::Argument argument;
                argument.location = m_currentLocation;
                if (!attributes.hasAttribute("direction"_L1) ||
                    attributes.value("direction"_L1) == "out"_L1) {
                    parseArg(attributes, argument);
                    arguments << argument;
                }
            } else {
                qDBusParserWarning("Unknown element '%s' while checking for signal arguments",
                                   qPrintable(m_xml.name().toString()));
            }
            m_xml.skipCurrentElement();
        } while (readNextStartElement());

        m_currentInterface->introspection += "    </signal>\n"_L1;
    }

    signalData.outputArgs = arguments;
    signalData.annotations = annotations;

    return true;
}